

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O1

void __thiscall Json_Whitespace_Test::TestBody(Json_Whitespace_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 auVar3 [8];
  _Alloc_hider _Var4;
  parser<json_out_callbacks> *ppVar5;
  long *plVar6;
  coord *pcVar7;
  size_type *psVar8;
  coord cVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *pcVar11;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__1;
  string res_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> lf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> keyword;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> crlf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cr;
  parser<json_out_callbacks> p1;
  undefined1 local_2e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  undefined1 local_2c0 [8];
  coord local_2b8;
  long local_2b0;
  coord cStack_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  result_type local_280;
  undefined1 local_260 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  result_type local_1e0;
  parser<json_out_callbacks> local_1c0;
  json_out_callbacks local_108;
  json_out_callbacks local_e8;
  json_out_callbacks local_c8;
  json_out_callbacks local_a8;
  json_out_callbacks local_88;
  json_out_callbacks local_68;
  span<const_char,__1L> local_40;
  
  paVar2 = &local_68.out_.field_2;
  local_68.out_.field_2._8_8_ = 0;
  local_68.out_._M_string_length = 0;
  local_68.out_.field_2._M_allocated_capacity = 0;
  local_68.out_._M_dataplus._M_p = (pointer)paVar2;
  pstore::json::parser<json_out_callbacks>::parser(&local_1c0,&local_68,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.out_._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.out_._M_dataplus._M_p,local_68.out_.field_2._M_allocated_capacity + 1);
  }
  local_250._M_allocated_capacity = 0x2020202009202020;
  local_250._8_4_ = 0x6c6c756e;
  local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000c;
  local_250._M_local_buf[0xc] = '\0';
  local_260 = (undefined1  [8])&local_250;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)local_200,0xc);
  local_1f8 = &local_250;
  ppVar5 = pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
                     (&local_1c0,(span<const_char,__1L> *)local_200);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_1e0,ppVar5);
  if (local_260 != (undefined1  [8])&local_250) {
    operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
  }
  local_200[0] = local_1c0.error_._M_value == 0;
  local_1f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  if (local_1c0.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_240);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_260,(internal *)local_200,(AssertionResult *)"p1.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x47,(char *)local_260);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if (local_260 != (undefined1  [8])&local_250) {
      operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
    }
    if ((long *)local_240._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_240._M_dataplus._M_p + 8))();
    }
  }
  if (local_1f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_260,"res","\"null\"",&local_1e0,(char (*) [5])0x18c61d);
  if (local_260[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_258 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_258->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x48,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_240,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_240);
    if ((coord)local_200 != (coord)0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  if (local_258 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_258,local_258);
  }
  local_200._0_4_ = local_1c0.coordinate_.column;
  local_200._4_4_ = local_1c0.coordinate_.row;
  local_240._M_dataplus._M_p = (pointer)0x10000000d;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_260,"p1.coordinate ()","(json::coord{13U, 1U})",(coord *)local_200,
             (coord *)&local_240);
  if (local_260[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_258 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_258->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x49,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_240,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_240);
    if ((coord)local_200 != (coord)0x0) {
      (**(code **)(*(size_type *)local_200 + 8))();
    }
  }
  if (local_258 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_258,local_258);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT62(local_1e0.field_2._M_allocated_capacity._2_6_,
                             local_1e0.field_2._M_allocated_capacity._0_2_) + 1);
  }
  paVar2 = &local_1c0.string_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.string_._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0.string_._M_dataplus._M_p,
                    local_1c0.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.callbacks_.out_._M_dataplus._M_p != &local_1c0.callbacks_.out_.field_2) {
    operator_delete(local_1c0.callbacks_.out_._M_dataplus._M_p,
                    local_1c0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1c0.stack_.c);
  if (local_1c0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1c0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  local_1e0.field_2._M_allocated_capacity._0_2_ = 0xd;
  local_1e0._M_string_length = 1;
  local_250._M_allocated_capacity._0_2_ = 10;
  local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_260 = (undefined1  [8])&local_250;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                 &local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_240.field_2._M_allocated_capacity._0_4_ = 0x6c6c756e;
  local_240._M_string_length = 4;
  local_240.field_2._M_allocated_capacity._4_4_ =
       local_240.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  paVar1 = &local_88.out_.field_2;
  local_88.out_.field_2._8_8_ = 0;
  local_88.out_._M_string_length = 0;
  local_88.out_.field_2._M_allocated_capacity = 0;
  local_88.out_._M_dataplus._M_p = (pointer)paVar1;
  pstore::json::parser<json_out_callbacks>::parser(&local_1c0,&local_88,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.out_._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.out_._M_dataplus._M_p,local_88.out_.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
  plVar6 = (long *)std::__cxx11::string::_M_append(local_2e0,(ulong)local_240._M_dataplus._M_p);
  paVar1 = &local_280.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_280.field_2._M_allocated_capacity = *psVar8;
    local_280.field_2._8_8_ = plVar6[3];
    local_280._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_280.field_2._M_allocated_capacity = *psVar8;
    local_280._M_dataplus._M_p = (pointer)*plVar6;
  }
  _Var4._M_p = local_280._M_dataplus._M_p;
  local_280._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)local_2c0,local_280._M_string_length);
  local_2b8 = (coord)_Var4._M_p;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_1c0,(span<const_char,__1L> *)local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_2e0 != (undefined1  [8])&local_2d0) {
    operator_delete((void *)local_2e0,local_2d0._M_allocated_capacity + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_280,&local_1c0);
  local_2c0[0] = local_1c0.error_._M_value == 0;
  local_2b8 = (coord)0x0;
  if (local_1c0.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2e0,(internal *)local_2c0,(AssertionResult *)"p2.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x56,(char *)local_2e0);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_220,(Message *)&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_220);
    if (local_2e0 != (undefined1  [8])&local_2d0) {
      operator_delete((void *)local_2e0,local_2d0._M_allocated_capacity + 1);
    }
    if ((long *)local_2a0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2a0._M_dataplus._M_p + 8))();
    }
  }
  if (local_2b8 != (coord)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2c0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_2e0,"res","keyword",&local_280,&local_240);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c0);
    if (local_2d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x57,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((coord)local_2c0 != (coord)0x0) {
      (**(code **)(*(long *)local_2c0 + 8))();
    }
  }
  if (local_2d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,local_2d8);
  }
  local_2c0._0_4_ = local_1c0.coordinate_.column;
  local_2c0._4_4_ = local_1c0.coordinate_.row;
  local_2a0._M_dataplus._M_p = &DAT_300000005;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_2e0,"p2.coordinate ()","(json::coord{xord, 3U})",(coord *)local_2c0,
             (coord *)&local_2a0);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c0);
    if (local_2d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x58,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((coord)local_2c0 != (coord)0x0) {
      (**(code **)(*(size_type *)local_2c0 + 8))();
    }
  }
  if (local_2d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,local_2d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.string_._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0.string_._M_dataplus._M_p,
                    local_1c0.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.callbacks_.out_._M_dataplus._M_p != &local_1c0.callbacks_.out_.field_2) {
    operator_delete(local_1c0.callbacks_.out_._M_dataplus._M_p,
                    local_1c0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1c0.stack_.c);
  if (local_1c0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1c0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  paVar10 = &local_a8.out_.field_2;
  local_a8.out_.field_2._8_8_ = 0;
  local_a8.out_._M_string_length = 0;
  local_a8.out_.field_2._M_allocated_capacity = 0;
  local_a8.out_._M_dataplus._M_p = (pointer)paVar10;
  pstore::json::parser<json_out_callbacks>::parser(&local_1c0,&local_a8,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.out_._M_dataplus._M_p != paVar10) {
    operator_delete(local_a8.out_._M_dataplus._M_p,local_a8.out_.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                 &local_1e0,&local_1e0);
  plVar6 = (long *)std::__cxx11::string::_M_append(local_2e0,(ulong)local_240._M_dataplus._M_p);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_280.field_2._M_allocated_capacity = *psVar8;
    local_280.field_2._8_8_ = plVar6[3];
    local_280._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_280.field_2._M_allocated_capacity = *psVar8;
    local_280._M_dataplus._M_p = (pointer)*plVar6;
  }
  _Var4._M_p = local_280._M_dataplus._M_p;
  local_280._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)local_2c0,local_280._M_string_length);
  local_2b8 = (coord)_Var4._M_p;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_1c0,(span<const_char,__1L> *)local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_2e0 != (undefined1  [8])&local_2d0) {
    operator_delete((void *)local_2e0,local_2d0._M_allocated_capacity + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_280,&local_1c0);
  local_2c0[0] = local_1c0.error_._M_value == 0;
  local_2b8 = (coord)0x0;
  if (local_1c0.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2e0,(internal *)local_2c0,(AssertionResult *)"p3.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x5e,(char *)local_2e0);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_220,(Message *)&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_220);
    if (local_2e0 != (undefined1  [8])&local_2d0) {
      operator_delete((void *)local_2e0,local_2d0._M_allocated_capacity + 1);
    }
    if ((long *)local_2a0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2a0._M_dataplus._M_p + 8))();
    }
  }
  if (local_2b8 != (coord)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2c0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_2e0,"res","keyword",&local_280,&local_240);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c0);
    if (local_2d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x5f,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((coord)local_2c0 != (coord)0x0) {
      (**(code **)(*(long *)local_2c0 + 8))();
    }
  }
  if (local_2d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,local_2d8);
  }
  local_2c0._0_4_ = local_1c0.coordinate_.column;
  local_2c0._4_4_ = local_1c0.coordinate_.row;
  local_2a0._M_dataplus._M_p = &DAT_300000005;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_2e0,"p3.coordinate ()","(json::coord{xord, 3U})",(coord *)local_2c0,
             (coord *)&local_2a0);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c0);
    if (local_2d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x60,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((coord)local_2c0 != (coord)0x0) {
      (**(code **)(*(size_type *)local_2c0 + 8))();
    }
  }
  if (local_2d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,local_2d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.string_._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0.string_._M_dataplus._M_p,
                    local_1c0.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.callbacks_.out_._M_dataplus._M_p != &local_1c0.callbacks_.out_.field_2) {
    operator_delete(local_1c0.callbacks_.out_._M_dataplus._M_p,
                    local_1c0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1c0.stack_.c);
  if (local_1c0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1c0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  paVar10 = &local_c8.out_.field_2;
  local_c8.out_.field_2._8_8_ = 0;
  local_c8.out_._M_string_length = 0;
  local_c8.out_.field_2._M_allocated_capacity = 0;
  local_c8.out_._M_dataplus._M_p = (pointer)paVar10;
  pstore::json::parser<json_out_callbacks>::parser(&local_1c0,&local_c8,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.out_._M_dataplus._M_p != paVar10) {
    operator_delete(local_c8.out_._M_dataplus._M_p,local_c8.out_.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
  plVar6 = (long *)std::__cxx11::string::_M_append(local_2e0,(ulong)local_240._M_dataplus._M_p);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_280.field_2._M_allocated_capacity = *psVar8;
    local_280.field_2._8_8_ = plVar6[3];
    local_280._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_280.field_2._M_allocated_capacity = *psVar8;
    local_280._M_dataplus._M_p = (pointer)*plVar6;
  }
  _Var4._M_p = local_280._M_dataplus._M_p;
  local_280._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)local_2c0,local_280._M_string_length);
  local_2b8 = (coord)_Var4._M_p;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_1c0,(span<const_char,__1L> *)local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_2e0 != (undefined1  [8])&local_2d0) {
    operator_delete((void *)local_2e0,local_2d0._M_allocated_capacity + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_280,&local_1c0);
  local_2c0[0] = local_1c0.error_._M_value == 0;
  local_2b8 = (coord)0x0;
  if (local_1c0.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2e0,(internal *)local_2c0,(AssertionResult *)"p4.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x66,(char *)local_2e0);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_220,(Message *)&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_220);
    if (local_2e0 != (undefined1  [8])&local_2d0) {
      operator_delete((void *)local_2e0,local_2d0._M_allocated_capacity + 1);
    }
    if ((long *)local_2a0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2a0._M_dataplus._M_p + 8))();
    }
  }
  if (local_2b8 != (coord)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2c0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_2e0,"res","keyword",&local_280,&local_240);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c0);
    if (local_2d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x67,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((coord)local_2c0 != (coord)0x0) {
      (**(code **)(*(long *)local_2c0 + 8))();
    }
  }
  if (local_2d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,local_2d8);
  }
  local_2c0._0_4_ = local_1c0.coordinate_.column;
  local_2c0._4_4_ = local_1c0.coordinate_.row;
  local_2a0._M_dataplus._M_p = &DAT_300000005;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_2e0,"p4.coordinate ()","(json::coord{xord, 3U})",(coord *)local_2c0,
             (coord *)&local_2a0);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c0);
    if (local_2d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x68,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((coord)local_2c0 != (coord)0x0) {
      (**(code **)(*(size_type *)local_2c0 + 8))();
    }
  }
  if (local_2d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,local_2d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.string_._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0.string_._M_dataplus._M_p,
                    local_1c0.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.callbacks_.out_._M_dataplus._M_p != &local_1c0.callbacks_.out_.field_2) {
    operator_delete(local_1c0.callbacks_.out_._M_dataplus._M_p,
                    local_1c0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1c0.stack_.c);
  if (local_1c0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1c0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  paVar2 = &local_e8.out_.field_2;
  local_e8.out_.field_2._8_8_ = 0;
  local_e8.out_._M_string_length = 0;
  local_e8.out_.field_2._M_allocated_capacity = 0;
  local_e8.out_._M_dataplus._M_p = (pointer)paVar2;
  pstore::json::parser<json_out_callbacks>::parser(&local_1c0,&local_e8,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.out_._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8.out_._M_dataplus._M_p,local_e8.out_.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 &local_1e0);
  plVar6 = (long *)std::__cxx11::string::_M_append(local_220,(ulong)local_260);
  paVar2 = &local_2a0.field_2;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_2a0.field_2._M_allocated_capacity = *psVar8;
    local_2a0.field_2._8_8_ = plVar6[3];
    local_2a0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_2a0.field_2._M_allocated_capacity = *psVar8;
    local_2a0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_2a0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pcVar7 = (coord *)std::__cxx11::string::_M_append
                              ((char *)&local_2a0,(ulong)local_1e0._M_dataplus._M_p);
  cVar9 = (coord)(pcVar7 + 2);
  if (*pcVar7 == cVar9) {
    local_2b0 = *(long *)cVar9;
    cStack_2a8 = pcVar7[3];
    local_2c0 = (undefined1  [8])&local_2b0;
  }
  else {
    local_2b0 = *(long *)cVar9;
    local_2c0 = (undefined1  [8])*pcVar7;
  }
  local_2b8 = pcVar7[1];
  *pcVar7 = cVar9;
  pcVar7[1].column = 0;
  pcVar7[1].row = 0;
  *(undefined1 *)&pcVar7[2].column = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append(local_2c0,(ulong)local_240._M_dataplus._M_p);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar10) {
    local_2d0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2d0._8_8_ = plVar6[3];
    local_2e0 = (undefined1  [8])&local_2d0;
  }
  else {
    local_2d0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2e0 = (undefined1  [8])*plVar6;
  }
  auVar3 = local_2e0;
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar6[1];
  *plVar6 = (long)paVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)&local_40,(index_type)local_2d8);
  local_40.storage_.data_ = (pointer)auVar3;
  ppVar5 = pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
                     (&local_1c0,&local_40);
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_280,ppVar5);
  if (local_2e0 != (undefined1  [8])&local_2d0) {
    operator_delete((void *)local_2e0,local_2d0._M_allocated_capacity + 1);
  }
  if (local_2c0 != (undefined1  [8])&local_2b0) {
    operator_delete((void *)local_2c0,local_2b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_220._0_8_ != (AssertHelperData *)(local_220 + 0x10)) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  local_2c0[0] = local_1c0.error_._M_value == 0;
  local_2b8 = (coord)0x0;
  if (local_1c0.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2e0,(internal *)local_2c0,(AssertionResult *)"p5.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x6f,(char *)local_2e0);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_220,(Message *)&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_220);
    if (local_2e0 != (undefined1  [8])&local_2d0) {
      operator_delete((void *)local_2e0,local_2d0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_2a0._M_dataplus._M_p + 8))();
    }
  }
  if (local_2b8 != (coord)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2c0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_2e0,"res","keyword",&local_280,&local_240);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c0);
    if (local_2d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x70,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((coord)local_2c0 != (coord)0x0) {
      (**(code **)(*(long *)local_2c0 + 8))();
    }
  }
  if (local_2d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,local_2d8);
  }
  local_2c0._0_4_ = local_1c0.coordinate_.column;
  local_2c0._4_4_ = local_1c0.coordinate_.row;
  local_2a0._M_dataplus._M_p = &DAT_400000005;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_2e0,"p5.coordinate ()","(json::coord{xord, 4U})",(coord *)local_2c0,
             (coord *)&local_2a0);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c0);
    if (local_2d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x71,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((coord)local_2c0 != (coord)0x0) {
      (**(code **)(*(size_type *)local_2c0 + 8))();
    }
  }
  if (local_2d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,local_2d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.string_._M_dataplus._M_p != &local_1c0.string_.field_2) {
    operator_delete(local_1c0.string_._M_dataplus._M_p,
                    local_1c0.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.callbacks_.out_._M_dataplus._M_p != &local_1c0.callbacks_.out_.field_2) {
    operator_delete(local_1c0.callbacks_.out_._M_dataplus._M_p,
                    local_1c0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1c0.stack_.c);
  if (local_1c0.singletons_._M_t.
      super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
      .super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>.
      _M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1c0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  paVar10 = &local_108.out_.field_2;
  local_108.out_.field_2._8_8_ = 0;
  local_108.out_._M_string_length = 0;
  local_108.out_.field_2._M_allocated_capacity = 0;
  local_108.out_._M_dataplus._M_p = (pointer)paVar10;
  pstore::json::parser<json_out_callbacks>::parser(&local_1c0,&local_108,none);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.out_._M_dataplus._M_p != paVar10) {
    operator_delete(local_108.out_._M_dataplus._M_p,local_108.out_.field_2._M_allocated_capacity + 1
                   );
  }
  std::operator+(&local_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260);
  pcVar7 = (coord *)std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_200);
  cVar9 = (coord)(pcVar7 + 2);
  if (*pcVar7 == cVar9) {
    local_2b0 = *(long *)cVar9;
    cStack_2a8 = pcVar7[3];
    local_2c0 = (undefined1  [8])&local_2b0;
  }
  else {
    local_2b0 = *(long *)cVar9;
    local_2c0 = (undefined1  [8])*pcVar7;
  }
  local_2b8 = pcVar7[1];
  *pcVar7 = cVar9;
  pcVar7[1].column = 0;
  pcVar7[1].row = 0;
  *(undefined1 *)&pcVar7[2].column = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append(local_2c0,(ulong)local_1e0._M_dataplus._M_p);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar10) {
    local_2d0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2d0._8_8_ = plVar6[3];
    local_2e0 = (undefined1  [8])&local_2d0;
  }
  else {
    local_2d0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2e0 = (undefined1  [8])*plVar6;
  }
  local_2d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)plVar6[1];
  *plVar6 = (long)paVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append(local_2e0,(ulong)local_240._M_dataplus._M_p);
  psVar8 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_280.field_2._M_allocated_capacity = *psVar8;
    local_280.field_2._8_8_ = plVar6[3];
    local_280._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_280.field_2._M_allocated_capacity = *psVar8;
    local_280._M_dataplus._M_p = (pointer)*plVar6;
  }
  _Var4._M_p = local_280._M_dataplus._M_p;
  local_280._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)local_220,local_280._M_string_length);
  local_220._8_8_ = _Var4._M_p;
  pstore::json::parser<json_out_callbacks>::input<pstore::gsl::span<char_const,_1l>>
            (&local_1c0,(span<const_char,__1L> *)local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_2e0 != (undefined1  [8])&local_2d0) {
    operator_delete((void *)local_2e0,local_2d0._M_allocated_capacity + 1);
  }
  if (local_2c0 != (undefined1  [8])&local_2b0) {
    operator_delete((void *)local_2c0,local_2b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_(&local_280,&local_1c0);
  local_2c0[0] = local_1c0.error_._M_value == 0;
  local_2b8 = (coord)0x0;
  if (local_1c0.error_._M_value != 0) {
    testing::Message::Message((Message *)&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2e0,(internal *)local_2c0,(AssertionResult *)"p6.has_error ()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x77,(char *)local_2e0);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_220,(Message *)&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_220);
    if (local_2e0 != (undefined1  [8])&local_2d0) {
      operator_delete((void *)local_2e0,local_2d0._M_allocated_capacity + 1);
    }
    if ((long *)local_2a0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2a0._M_dataplus._M_p + 8))();
    }
  }
  if (local_2b8 != (coord)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_2c0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_2e0,"res","\"null\"",&local_280,(char (*) [5])0x18c61d);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c0);
    if (local_2d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x78,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((coord)local_2c0 != (coord)0x0) {
      (**(code **)(*(long *)local_2c0 + 8))();
    }
  }
  if (local_2d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,local_2d8);
  }
  local_2c0._0_4_ = local_1c0.coordinate_.column;
  local_2c0._4_4_ = local_1c0.coordinate_.row;
  local_2a0._M_dataplus._M_p = (pointer)0x500000005;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_2e0,"p6.coordinate ()","(json::coord{xord, 5U})",(coord *)local_2c0,
             (coord *)&local_2a0);
  if (local_2e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2c0);
    if (local_2d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = (local_2d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x79,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a0,(Message *)local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a0);
    if ((coord)local_2c0 != (coord)0x0) {
      (**(code **)(*(size_type *)local_2c0 + 8))();
    }
  }
  if (local_2d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d8,local_2d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != paVar1) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.string_._M_dataplus._M_p != &local_1c0.string_.field_2) {
    operator_delete(local_1c0.string_._M_dataplus._M_p,
                    local_1c0.string_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.callbacks_.out_._M_dataplus._M_p != &local_1c0.callbacks_.out_.field_2) {
    operator_delete(local_1c0.callbacks_.out_._M_dataplus._M_p,
                    local_1c0.callbacks_.out_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
  ::~deque(&local_1c0.stack_.c);
  if ((__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )local_1c0.singletons_._M_t.
        super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
        ._M_head_impl !=
      (__uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
       )0x0) {
    operator_delete((void *)local_1c0.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<json_out_callbacks>,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<json_out_callbacks>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<json_out_callbacks>_*,_false>
                            ._M_head_impl,0x68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT44(local_240.field_2._M_allocated_capacity._4_4_,
                             local_240.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_200 != (undefined1  [8])&local_1f0) {
    operator_delete((void *)local_200,local_1f0._M_allocated_capacity + 1);
  }
  if (local_260 != (undefined1  [8])&local_250) {
    operator_delete((void *)local_260,local_250._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT62(local_1e0.field_2._M_allocated_capacity._2_6_,
                             local_1e0.field_2._M_allocated_capacity._0_2_) + 1);
  }
  return;
}

Assistant:

TEST_F (Json, Whitespace) {
    {
        json::parser<json_out_callbacks> p1;
        std::string const res = p1.input ("   \t    null"s).eof ();
        EXPECT_FALSE (p1.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p1.coordinate (), (json::coord{13U, 1U}));
    }

    auto const cr = "\r"s;
    auto const lf = "\n"s;
    auto const crlf = cr + lf;
    auto const keyword = "null"s;
    auto const xord = static_cast<unsigned> (keyword.length ()) + 1U;

    {
        json::parser<json_out_callbacks> p2;
        p2.input (lf + lf + keyword); // POSIX-style line endings
        std::string const res = p2.eof ();
        EXPECT_FALSE (p2.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p2.coordinate (), (json::coord{xord, 3U}));
    }
    {
        json::parser<json_out_callbacks> p3;
        p3.input (cr + cr + keyword); // MacOS Classic line endings
        std::string const res = p3.eof ();
        EXPECT_FALSE (p3.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p3.coordinate (), (json::coord{xord, 3U}));
    }
    {
        json::parser<json_out_callbacks> p4;
        p4.input (crlf + crlf + keyword); // Windows-style CRLF
        std::string const res = p4.eof ();
        EXPECT_FALSE (p4.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p4.coordinate (), (json::coord{xord, 3U}));
    }
    {
        json::parser<json_out_callbacks> p5;
        // Nobody's line-endings. Each counts as a new line. Note that the middle cr+lf pair will
        // match a single Windows crlf.
        std::string const res = p5.input (lf + cr + lf + cr + keyword).eof ();
        EXPECT_FALSE (p5.has_error ());
        EXPECT_EQ (res, keyword);
        EXPECT_EQ (p5.coordinate (), (json::coord{xord, 4U}));
    }
    {
        json::parser<json_out_callbacks> p6;
        p6.input (lf + lf + crlf + cr + keyword); // A groovy mixture of line-ending characters.
        std::string const res = p6.eof ();
        EXPECT_FALSE (p6.has_error ());
        EXPECT_EQ (res, "null");
        EXPECT_EQ (p6.coordinate (), (json::coord{xord, 5U}));
    }
}